

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O3

void __thiscall
argsman_tests::util_ParseInvalidParameters::test_method(util_ParseInvalidParameters *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar6;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 local_3a0 [16];
  undefined1 *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  assertion_result local_328;
  char **local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  char *local_300;
  char *local_2f8;
  assertion_result local_2f0;
  string error;
  char *argv [2];
  undefined1 local_2a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  uint local_288;
  TestArgsManager test;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&test.super_ArgsManager);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&test.super_ArgsManager.m_network_only_args._M_t);
  local_2a8._0_8_ = &local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"-registered","");
  local_288 = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)local_2a8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_328,__l,(allocator_type *)&error);
  TestArgsManager::SetupArgs
            (&test,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)&local_328);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._0_8_ != &local_298) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._M_allocated_capacity + 1));
  }
  argv[0] = "ignored";
  argv[1] = "-registered";
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xfd;
  file.m_begin = (iterator)&local_340;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_350,msg);
  _cVar6 = 0x26b02e;
  bVar2 = ArgsManager::ParseParameters(&test.super_ArgsManager,2,argv,&error);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._8_8_ = local_3a0;
  local_3a0._0_8_ = "test.ParseParameters(2, argv, error)";
  local_3a0._8_8_ = "";
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_01389048;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_358 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_2a8,1,0,WARN,_cVar6,(size_t)&local_360,0xfd);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xfe;
  file_00.m_begin = (iterator)&local_370;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_380,
             msg_00);
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_390 = boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&error,"");
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_2f8 = "";
  local_298._8_8_ = &local_308;
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  local_330 = "";
  local_328.m_message.px = (element_type *)((ulong)local_328.m_message.px & 0xffffffffffffff00);
  local_328._0_8_ = &PTR__lazy_ostream_01389558;
  local_328.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_308 = &error;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_3a0,1,2,REQUIRE,0x1104f9f,(size_t)&local_300,0xfe,
             local_2a8,"\"\"",&local_328);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  argv[1] = "-unregistered";
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x101;
  file_01.m_begin = (iterator)&local_3b0;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c0,
             msg_01);
  _cVar6 = 0x26b28b;
  bVar2 = ArgsManager::ParseParameters(&test.super_ArgsManager,2,argv,&error);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a0._0_8_ = "!test.ParseParameters(2, argv, error)";
  local_3a0._8_8_ = "";
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_01389048;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3c8 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_298._8_8_ = (lazy_ostream *)local_3a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_2a8,1,0,WARN,_cVar6,(size_t)&local_3d0,0x101);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x102;
  file_02.m_begin = (iterator)&local_3e0;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3f0,
             msg_02);
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_390 = boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&error,"Invalid parameter -unregistered");
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_2f8 = "";
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_298._8_8_ = &local_308;
  local_330 = "Invalid parameter -unregistered";
  local_328.m_message.px = (element_type *)((ulong)local_328.m_message.px & 0xffffffffffffff00);
  local_328._0_8_ = &PTR__lazy_ostream_01389618;
  local_328.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_308 = &error;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_3a0,1,2,REQUIRE,0x1104f9f,(size_t)&local_300,0x102,
             local_2a8,"\"Invalid parameter -unregistered\"",&local_328);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  argv[1] = "-test.registered";
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x107;
  file_03.m_begin = (iterator)&local_400;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_410,
             msg_03);
  _cVar6 = 0x26b4e5;
  bVar2 = ArgsManager::ParseParameters(&test.super_ArgsManager,2,argv,&error);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a0._0_8_ = "!test.ParseParameters(2, argv, error)";
  local_3a0._8_8_ = "";
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_01389048;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_418 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_298._8_8_ = (lazy_ostream *)local_3a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_2a8,1,0,WARN,_cVar6,(size_t)&local_420,0x107);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x108;
  file_04.m_begin = (iterator)&local_430;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_440,
             msg_04);
  local_3a0._8_8_ = local_3a0._8_8_ & 0xffffffffffffff00;
  local_3a0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_390 = boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&error,"Invalid parameter -test.registered");
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_2f8 = "";
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_298._8_8_ = &local_308;
  local_330 = "Invalid parameter -test.registered";
  local_328.m_message.px = (element_type *)((ulong)local_328.m_message.px & 0xffffffffffffff00);
  local_328._0_8_ = &PTR__lazy_ostream_01389658;
  local_328.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  local_308 = &error;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_3a0,1,2,REQUIRE,0x1104f9f,(size_t)&local_300,0x108,
             (lazy_ostream *)local_2a8,"\"Invalid parameter -test.registered\"",&local_328);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error._M_dataplus._M_p != &error.field_2) {
    operator_delete(error._M_dataplus._M_p,
                    CONCAT71(error.field_2._M_allocated_capacity._1_7_,error.field_2._M_local_buf[0]
                            ) + 1);
  }
  ArgsManager::~ArgsManager(&test.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseInvalidParameters)
{
    TestArgsManager test;
    test.SetupArgs({{"-registered", ArgsManager::ALLOW_ANY}});

    const char* argv[] = {"ignored", "-registered"};
    std::string error;
    BOOST_CHECK(test.ParseParameters(2, argv, error));
    BOOST_CHECK_EQUAL(error, "");

    argv[1] = "-unregistered";
    BOOST_CHECK(!test.ParseParameters(2, argv, error));
    BOOST_CHECK_EQUAL(error, "Invalid parameter -unregistered");

    // Make sure registered parameters prefixed with a chain type trigger errors.
    // (Previously, they were accepted and ignored.)
    argv[1] = "-test.registered";
    BOOST_CHECK(!test.ParseParameters(2, argv, error));
    BOOST_CHECK_EQUAL(error, "Invalid parameter -test.registered");
}